

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

void __thiscall tinyxml2::XMLPrinter::Write(XMLPrinter *this,char *data,size_t size)

{
  int iVar1;
  char *pcVar2;
  
  if ((FILE *)this->_fp != (FILE *)0x0) {
    fwrite(data,1,size,(FILE *)this->_fp);
    return;
  }
  DynArray<char,_20>::EnsureCapacity(&this->_buffer,(this->_buffer)._size + (int)size);
  pcVar2 = (this->_buffer)._mem;
  iVar1 = (this->_buffer)._size;
  (this->_buffer)._size = iVar1 + (int)size;
  memcpy(pcVar2 + (long)iVar1 + -1,data,size);
  pcVar2[(size - 1) + (long)iVar1] = '\0';
  return;
}

Assistant:

void XMLPrinter::Write(const char* data, size_t size)
{
    if (_fp) {
        fwrite(data, sizeof(char), size, _fp);
    } else {
        char* p = _buffer.PushArr(static_cast<int>(size)) - 1; // back up over the null terminator.
        memcpy(p, data, size);
        p[size] = 0;
    }
}